

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

uint32 __thiscall
Js::JavascriptCopyOnAccessNativeIntArray::GetNextIndex
          (JavascriptCopyOnAccessNativeIntArray *this,uint32 index)

{
  uint uVar1;
  uint32 uVar2;
  uint32 uVar3;
  
  uVar1 = (this->super_JavascriptNativeIntArray).super_JavascriptNativeArray.super_JavascriptArray.
          super_ArrayObject.length;
  if (uVar1 == 0) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar3 = 0xffffffff;
    if (index < uVar1) {
      uVar3 = index + 1;
    }
    uVar2 = index + 1;
    if (index + 1 != 0) {
      uVar2 = uVar3;
    }
  }
  return uVar2;
}

Assistant:

uint32 JavascriptCopyOnAccessNativeIntArray::GetNextIndex(uint32 index) const
    {
        if (this->length == 0 || (index != Js::JavascriptArray::InvalidIndex && index >= this->length))
        {
            return Js::JavascriptArray::InvalidIndex;
        }
        else if (index == Js::JavascriptArray::InvalidIndex)
        {
            return 0;
        }
        else
        {
            return index + 1;
        }
    }